

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

ssize_t archive_write_ar_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  void *pvVar3;
  ulong in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int ret;
  ar_w *ar;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_t local_20;
  size_t local_8;
  
  puVar1 = *(ulong **)&in_RDI[1].current_codepage;
  local_20 = in_RDX;
  if (*puVar1 < in_RDX) {
    local_20 = *puVar1;
  }
  if (0 < (int)puVar1[2]) {
    if (0 < *(int *)((long)puVar1 + 0x14)) {
      archive_set_error(in_RDI,0x16,"More than one string tables exist");
      return -0x14;
    }
    pvVar3 = malloc(local_20);
    puVar1[4] = (ulong)pvVar3;
    if (puVar1[4] == 0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate strtab buffer");
      return -0x1e;
    }
    strncpy((char *)puVar1[4],in_RSI,local_20);
    *(undefined4 *)((long)puVar1 + 0x14) = 1;
  }
  iVar2 = __archive_write_output
                    ((archive_write *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,0x1aac3d);
  if (iVar2 == 0) {
    *puVar1 = *puVar1 - local_20;
    local_8 = local_20;
  }
  else {
    local_8 = (size_t)iVar2;
  }
  return local_8;
}

Assistant:

static ssize_t
archive_write_ar_data(struct archive_write *a, const void *buff, size_t s)
{
	struct ar_w *ar;
	int ret;

	ar = (struct ar_w *)a->format_data;
	if (s > ar->entry_bytes_remaining)
		s = (size_t)ar->entry_bytes_remaining;

	if (ar->is_strtab > 0) {
		if (ar->has_strtab > 0) {
			archive_set_error(&a->archive, EINVAL,
			    "More than one string tables exist");
			return (ARCHIVE_WARN);
		}

		ar->strtab = (char *)malloc(s);
		if (ar->strtab == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate strtab buffer");
			return (ARCHIVE_FATAL);
		}
		strncpy(ar->strtab, buff, s);
		ar->has_strtab = 1;
	}

	ret = __archive_write_output(a, buff, s);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining -= s;
	return (s);
}